

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O1

void __thiscall
ON_SubDFaceIterator::ON_SubDFaceIterator
          (ON_SubDFaceIterator *this,ON_SubD *subd,ON_SubDVertex *vertex)

{
  uint face_count;
  ON_SubDFace *first;
  ON_SubDFace *last;
  ON_SubDComponentPtr component_ptr;
  ON_SubDRef OStack_38;
  
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_face_current = (ON_SubDFace *)0x0;
  this->m_face_index = 0;
  this->m_face_count = 0;
  this->m_face_first = (ON_SubDFace *)0x0;
  this->m_face_last = (ON_SubDFace *)0x0;
  (this->m_component_ptr).m_ptr = 0;
  face_count = ON_SubDVertex::FaceCount(vertex);
  ON_SubDRef::CreateReferenceForExperts(&OStack_38,subd);
  first = ON_SubDVertex::Face(vertex,0);
  last = ON_SubDVertex::Face(vertex,face_count - 1);
  component_ptr = ON_SubDComponentPtr::Create(vertex);
  Internal_Init(this,&OStack_38,face_count,first,last,component_ptr);
  ON_SubDRef::~ON_SubDRef(&OStack_38);
  return;
}

Assistant:

ON_SubDFaceIterator::ON_SubDFaceIterator(
  const class ON_SubD& subd,
  const class ON_SubDVertex& vertex
)
{
  const unsigned int face_count = vertex.FaceCount();
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    face_count,
    vertex.Face(0),
    vertex.Face(face_count - 1),
    ON_SubDComponentPtr::Create(&vertex)
  );
}